

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.cc
# Opt level: O3

void __thiscall gss::innards::SVOBitset::SVOBitset(SVOBitset *this,uint size,uint bits)

{
  undefined1 auVar1 [64];
  BitWord *pBVar2;
  uint i;
  ulong uVar3;
  undefined1 auVar4 [64];
  
  this->n_words = size + 0x3f >> 6;
  if (size + 0x3f < 0x440) {
    auVar4 = vpbroadcastq_avx512f();
    auVar1 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])&this->_data = auVar1;
    auVar1 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])((long)&this->_data + 0x40) = auVar1;
  }
  else {
    pBVar2 = (BitWord *)operator_new__((ulong)size * 8);
    (this->_data).long_data = pBVar2;
    uVar3 = 0;
    do {
      (this->_data).long_data[uVar3] = (ulong)bits;
      uVar3 = uVar3 + 1;
    } while (size != uVar3);
  }
  return;
}

Assistant:

SVOBitset::SVOBitset(unsigned size, unsigned bits)
{
    n_words = (size + bits_per_word - 1) / (bits_per_word);
    if (n_words <= svo_size) {
        for (unsigned i = 0; i < svo_size; ++i)
            _data.short_data[i] = bits;
    }
    else {
        _data.long_data = new BitWord[size];
        for (unsigned i = 0; i < size; ++i)
            _data.long_data[i] = bits;
    }
}